

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O2

void __thiscall OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc)

{
  Vector3d *this_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  mapped_type *pmVar4;
  double dVar5;
  Vector3d frc;
  Vector3d del;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  (this->super_Restraint).pot_ = 0.0;
  this_00 = &this->force_;
  Vector<double,_3U>::operator=
            (&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  uVar3 = (this->super_Restraint).restType_;
  if ((uVar3 & 1) != 0) {
    operator-(&local_78,&struc->super_Vector<double,_3U>,&(this->refPos_).super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&local_48,&local_78);
    dVar2 = Vector<double,_3U>::length(&local_48);
    operator*(&local_60,-(this->super_Restraint).kDisp_,&local_48);
    Vector<double,_3U>::Vector(&local_78,&local_60);
    dVar1 = (this->super_Restraint).kDisp_;
    dVar5 = Vector<double,_3U>::lengthSquare(&local_48);
    dVar5 = dVar5 * dVar1 * 0.5;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar5;
    operator*(&local_60,&local_78,(this->super_Restraint).scaleFactor_);
    Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,&local_60);
    if ((this->super_Restraint).printRest_ == true) {
      local_60.data_[0]._0_4_ = 1;
      pmVar4 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&local_60);
      pmVar4->first = dVar2;
      pmVar4->second = dVar5;
    }
    uVar3 = (this->super_Restraint).restType_;
  }
  if ((uVar3 & 2) != 0) {
    dVar2 = (struc->super_Vector<double,_3U>).data_[2] - (this->super_Restraint).posZ0_;
    dVar1 = (this->super_Restraint).kAbs_;
    Vector<double,_3U>::Vector(&local_48);
    local_48.data_[0] = 0.0;
    local_48.data_[1] = 0.0;
    dVar5 = (this->super_Restraint).kAbs_ * 0.5 * dVar2 * dVar2;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar5;
    local_48.data_[2] = -dVar1 * dVar2;
    operator*(&local_78,&local_48,(this->super_Restraint).scaleFactor_);
    Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,&local_78);
    if ((this->super_Restraint).printRest_ == true) {
      local_78.data_[0]._0_4_ = 2;
      pmVar4 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&local_78);
      pmVar4->first = dVar2;
      pmVar4->second = dVar5;
    }
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc) {
    pot_   = 0.0;
    force_ = V3Zero;

    if (restType_ & rtDisplacement) {
      Vector3d del = struc - refPos_;
      RealType r   = del.length();
      Vector3d frc = -kDisp_ * del;
      RealType p   = 0.5 * kDisp_ * del.lengthSquare();

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = struc(2) - posZ0_;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);
      RealType p   = 0.5 * kAbs_ * r * r;

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);
    }
  }